

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

int zip_load_entries(ZIPinfo *info,PHYSFS_uint64 data_ofs,PHYSFS_uint64 central_ofs,
                    PHYSFS_uint64 entry_count)

{
  int zip64_00;
  int iVar1;
  ZIPentry *entry_00;
  ZIPentry *entry;
  PHYSFS_uint64 i;
  int zip64;
  PHYSFS_Io *io;
  PHYSFS_uint64 entry_count_local;
  PHYSFS_uint64 central_ofs_local;
  PHYSFS_uint64 data_ofs_local;
  ZIPinfo *info_local;
  
  zip64_00 = info->zip64;
  iVar1 = (*info->io->seek)(info->io,central_ofs);
  if (iVar1 == 0) {
    info_local._4_4_ = 0;
  }
  else {
    for (entry = (ZIPentry *)0x0; entry < entry_count;
        entry = (ZIPentry *)((long)&(entry->tree).name + 1)) {
      entry_00 = zip_load_entry(info,zip64_00,data_ofs);
      if (entry_00 == (ZIPentry *)0x0) {
        return 0;
      }
      iVar1 = zip_entry_is_tradional_crypto(entry_00);
      if (iVar1 != 0) {
        info->has_crypto = 1;
      }
    }
    info_local._4_4_ = 1;
  }
  return info_local._4_4_;
}

Assistant:

static int zip_load_entries(ZIPinfo *info,
                            const PHYSFS_uint64 data_ofs,
                            const PHYSFS_uint64 central_ofs,
                            const PHYSFS_uint64 entry_count)
{
    PHYSFS_Io *io = info->io;
    const int zip64 = info->zip64;
    PHYSFS_uint64 i;

    BAIL_IF_ERRPASS(!io->seek(io, central_ofs), 0);

    for (i = 0; i < entry_count; i++)
    {
        ZIPentry *entry = zip_load_entry(info, zip64, data_ofs);
        BAIL_IF_ERRPASS(!entry, 0);
        if (zip_entry_is_tradional_crypto(entry))
            info->has_crypto = 1;
    } /* for */

    return 1;
}